

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

PSocket * p_socket_new_from_fd(pint fd,PError **error)

{
  pboolean pVar1;
  PSocket *ret;
  PError **error_local;
  PSocket *pPStack_10;
  pint fd_local;
  
  if (fd < 0) {
    p_error_set_error_p(error,0x1fb,0,"Unable to create socket from bad fd");
    pPStack_10 = (PSocket *)0x0;
  }
  else {
    pPStack_10 = (PSocket *)p_malloc0(0x1c);
    if (pPStack_10 == (PSocket *)0x0) {
      p_error_set_error_p(error,0x1f5,0,"Failed to allocate memory for socket");
      pPStack_10 = (PSocket *)0x0;
    }
    else {
      pPStack_10->fd = fd;
      pVar1 = pp_socket_set_details_from_fd(pPStack_10,error);
      if (pVar1 == 0) {
        p_free(pPStack_10);
        pPStack_10 = (PSocket *)0x0;
      }
      else {
        pVar1 = pp_socket_set_fd_blocking(pPStack_10->fd,0,error);
        if (pVar1 == 0) {
          p_free(pPStack_10);
          pPStack_10 = (PSocket *)0x0;
        }
        else {
          p_socket_set_listen_backlog(pPStack_10,5);
          pPStack_10->timeout = 0;
          pPStack_10->field_0x18 = pPStack_10->field_0x18 & 0xfe | 1;
        }
      }
    }
  }
  return pPStack_10;
}

Assistant:

P_LIB_API PSocket *
p_socket_new_from_fd (pint	fd,
		      PError	**error)
{
	PSocket	*ret;
#if !defined (P_OS_WIN) && defined (SO_NOSIGPIPE)
	pint	flags;
#endif

	if (P_UNLIKELY (fd < 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Unable to create socket from bad fd");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSocket))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for socket");
		return NULL;
	}

	ret->fd = fd;

	if (P_UNLIKELY (pp_socket_set_details_from_fd (ret, error) == FALSE)) {
		p_free (ret);
		return NULL;
	}

	if (P_UNLIKELY (pp_socket_set_fd_blocking (ret->fd, FALSE, error) == FALSE)) {
		p_free (ret);
		return NULL;
	}

#if !defined (P_OS_WIN) && defined (SO_NOSIGPIPE)
	flags = 1;

	if (setsockopt (ret->fd, SOL_SOCKET, SO_NOSIGPIPE, &flags, sizeof (flags)) < 0)
		P_WARNING ("PSocket::p_socket_new_from_fd: setsockopt() with SO_NOSIGPIPE failed");
#endif

	p_socket_set_listen_backlog (ret, P_SOCKET_DEFAULT_BACKLOG);

	ret->timeout  = 0;
	ret->blocking = TRUE;

#ifdef P_OS_SCO
	if (P_UNLIKELY ((ret->timer = p_time_profiler_new ()) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for internal timer");
		p_free (ret);
		return NULL;
	}
#endif

#ifdef P_OS_WIN
	if (P_UNLIKELY ((ret->events = WSACreateEvent ()) == WSA_INVALID_EVENT)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     (pint) p_error_get_last_net (),
				     "Failed to call WSACreateEvent() on socket");
		p_free (ret);
		return NULL;
	}
#endif

	return ret;
}